

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O2

void __thiscall soul::TaskThread::addQueue(TaskThread *this,Queue *queue)

{
  pthread_t pVar1;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_38;
  unique_lock<std::mutex> local_28;
  
  local_38._M_device = (mutex_type *)0x0;
  local_38._M_owns = false;
  pVar1 = pthread_self();
  if (pVar1 != (this->thread)._M_id._M_thread) {
    std::unique_lock<std::mutex>::unique_lock(&local_28,&this->queueLock);
    std::unique_lock<std::mutex>::operator=(&local_38,&local_28);
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
  }
  local_28._M_device = (mutex_type *)queue;
  std::vector<soul::TaskThread::Queue*,std::allocator<soul::TaskThread::Queue*>>::
  emplace_back<soul::TaskThread::Queue*>
            ((vector<soul::TaskThread::Queue*,std::allocator<soul::TaskThread::Queue*>> *)
             &this->queues,(Queue **)&local_28);
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return;
}

Assistant:

void addQueue (Queue& queue)
    {
        std::unique_lock<std::mutex> l;

        if (std::this_thread::get_id() != thread.get_id())
            l = std::unique_lock<std::mutex> (queueLock);

        queues.push_back (std::addressof (queue));
    }